

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

int * __thiscall ConvexDecomposition::Array<int>::Add(Array<int> *this,int t)

{
  int iVar1;
  int *piVar2;
  int s;
  
  iVar1 = this->array_size;
  if (this->count <= iVar1) {
    if (this->count == iVar1) {
      s = 0x10;
      if (iVar1 != 0) {
        s = iVar1 * 2;
      }
      allocate(this,s);
    }
    piVar2 = this->element;
    iVar1 = this->count;
    this->count = iVar1 + 1;
    piVar2[iVar1] = t;
    return piVar2 + (long)this->count + -1;
  }
  __assert_fail("count<=array_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x5e8,"Type &ConvexDecomposition::Array<int>::Add(Type) [Type = int]");
}

Assistant:

Type& Array<Type>::Add(Type t)
{
	assert(count<=array_size);
	if(count==array_size)
	{
		allocate((array_size)?array_size *2:16);
	}
	element[count++] = t;
	return element[count-1];
}